

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O2

void test_bson_writer_shared_buffer(void)

{
  char cVar1;
  undefined8 uVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  undefined8 uStack_90;
  char *key;
  bson_t *b;
  uint8_t *buf;
  size_t buflen;
  char keystr [32];
  
  buf = (uint8_t *)bson_malloc0(0x20);
  buflen = 0x20;
  uVar3 = 0;
  uVar2 = bson_writer_new(&buf,&buflen,0,bson_realloc_ctx,0);
  do {
    if (uVar3 == 10000) {
      bVar6 = false;
LAB_0012d816:
      uVar5 = bson_writer_get_length(uVar2);
      bson_writer_destroy(uVar2);
      if (uVar5 < 0x3000000) {
        if (bVar6) {
          bson_free(buf);
          return;
        }
        pcVar4 = "FAIL\n\nAssert Failure: (line#%d)rolled_back == true\n";
        uStack_90 = 0x62;
      }
      else {
        pcVar4 = "FAIL\n\nAssert Failure: (line#%d)n_bytes < (48 * 1024 * 1024)\n";
        uStack_90 = 0x61;
      }
      fprintf(_stderr,pcVar4,uStack_90);
      abort();
    }
    cVar1 = bson_writer_begin(uVar2,&b);
    if (cVar1 == '\0') {
      pcVar4 = "bson_writer_begin (writer, &b)";
      uStack_90 = 0x4d;
LAB_0012d87f:
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
              ,uStack_90,"test_bson_writer_shared_buffer",pcVar4);
      abort();
    }
    uVar5 = 0;
    while (uVar5 != 1000) {
      bson_uint32_to_string(uVar5 & 0xffffffff,&key,keystr,0x20);
      cVar1 = bson_append_int64(b,key,0xffffffff,uVar5);
      uVar5 = uVar5 + 1;
      if (cVar1 == '\0') {
        pcVar4 = "bson_append_int64 (b, key, -1, j)";
        uStack_90 = 0x51;
        goto LAB_0012d87f;
      }
    }
    uVar5 = bson_writer_get_length(uVar2);
    if (0x3000000 < uVar5) {
      bVar6 = uVar3 < 10000;
      bson_writer_rollback(uVar2);
      goto LAB_0012d816;
    }
    bson_writer_end(uVar2);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void
test_bson_writer_shared_buffer (void)
{
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc0 (32);
   bool rolled_back = false;
   size_t buflen = 32;
   size_t n_bytes;
   bson_t *b;
   const char *key;
   char keystr[32];
   int i = 0;
   int j = 0;
   int n_docs = 10000;

   writer = bson_writer_new (&buf, &buflen, 0, bson_realloc_ctx, NULL);

   for (i = 0; i < n_docs; i++) {
      BSON_ASSERT (bson_writer_begin (writer, &b));

      for (j = 0; j < 1000; j++) {
         bson_uint32_to_string (j, &key, keystr, sizeof keystr);
         BSON_ASSERT (bson_append_int64 (b, key, -1, j));
      }

      if (bson_writer_get_length (writer) > (48 * 1024 * 1024)) {
         rolled_back = true;
         bson_writer_rollback (writer);
         break;
      } else {
         bson_writer_end (writer);
      }
   }

   n_bytes = bson_writer_get_length (writer);

   bson_writer_destroy (writer);

   BSON_ASSERT_CMPINT (n_bytes, <, (48 * 1024 * 1024));
   BSON_ASSERT_CMPINT (rolled_back, ==, true);
   BSON_ASSERT (rolled_back);

   bson_free (buf);
}